

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

int Curl_ssl_init(void)

{
  int local_c;
  
  if (init_ssl) {
    local_c = 1;
  }
  else {
    init_ssl = true;
    if (Curl_ssl->init == (_func_int *)0x0) {
      local_c = 1;
    }
    else {
      local_c = (*Curl_ssl->init)();
    }
  }
  return local_c;
}

Assistant:

int Curl_ssl_init(void)
{
  /* make sure this is only done once */
  if(init_ssl)
    return 1;
  init_ssl = TRUE; /* never again */

  if(Curl_ssl->init)
    return Curl_ssl->init();
  return 1;
}